

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdb.h
# Opt level: O2

uint cdb_append(cdb *p,uint size)

{
  uint uVar1;
  char *__assertion;
  
  if (size == 0) {
    __assertion = "size > 0";
    uVar1 = 0x47;
  }
  else {
    cdb_grow(p,p->size + size);
    uVar1 = p->size;
    p->size = size + uVar1;
    if (uVar1 < size + uVar1) {
      return uVar1;
    }
    __assertion = "p->size > prev_size";
    uVar1 = 0x4b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/cdb.h"
                ,uVar1,"unsigned int cdb_append(struct cdb *, unsigned int)");
}

Assistant:

static inline unsigned cdb_append(struct cdb *p, unsigned size)
{
    unsigned prev_size;
    assert(size > 0);
    cdb_grow(p, p->size + size);
    prev_size = p->size;
    p->size += size;
    assert(p->size > prev_size);
    return prev_size;
}